

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RandomGen.cpp
# Opt level: O2

void __thiscall RandomGen::SetSeed(RandomGen *this,uint64_t s)

{
  uint64_t z;
  uint64_t uVar1;
  runtime_error *this_00;
  uint64_t uVar2;
  
  if (this->rng_locked != true) {
    z = splitmix64(s);
    uVar1 = splitmix64(z);
    uVar2 = 1;
    if (uVar1 != 0 || z != 0) {
      uVar2 = uVar1;
    }
    (this->rng).super_xoroshiro<unsigned_long,_unsigned_long,_24U,_16U,_37U>.s0_ = z;
    (this->rng).super_xoroshiro<unsigned_long,_unsigned_long,_24U,_16U,_37U>.s1_ = uVar2;
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"You can not change the seed because it is locked.");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void RandomGen::SetSeed(uint64_t s) {
  if (rng_locked) {
    throw std::runtime_error("You can not change the seed because it is locked.");
  }
  uint64_t s1 = splitmix64(s);
  rng = xoroshiro128plus64(s1, splitmix64(s1));
}